

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O0

void __thiscall
OpenMD::CubicSpline::getValueAndDerivativeAt(CubicSpline *this,RealType *t,RealType *v,RealType *dv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  reference pvVar7;
  int *piVar8;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  int i;
  CubicSpline *in_stack_000002f0;
  int local_2c [3];
  double *local_20;
  double *local_18;
  double *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 9) & 1) == 0) {
    generate(in_stack_000002f0);
  }
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    *(int *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x20) + -1;
    for (local_2c[2] = 0; local_2c[2] < *(int *)(in_RDI + 0x20); local_2c[2] = local_2c[2] + 1) {
      dVar1 = *local_10;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),
                          (long)local_2c[2]);
      if (dVar1 < *pvVar7) {
        *(int *)(in_RDI + 0x24) = local_2c[2] + -1;
        break;
      }
    }
  }
  else {
    dVar1 = *local_10;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),0);
    *(int *)(in_RDI + 0x24) = (int)((dVar1 - *pvVar7) * *(double *)(in_RDI + 0x10));
  }
  local_2c[1] = 0;
  local_2c[0] = *(int *)(in_RDI + 0x20) + -1;
  piVar8 = std::clamp<int>((int *)(in_RDI + 0x24),local_2c + 1,local_2c);
  *(int *)(in_RDI + 0x24) = *piVar8;
  dVar1 = *local_10;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),
                      (long)*(int *)(in_RDI + 0x24));
  *(double *)(in_RDI + 0x18) = dVar1 - *pvVar7;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),
                      (long)*(int *)(in_RDI + 0x24));
  dVar1 = *pvVar7;
  dVar2 = *(double *)(in_RDI + 0x18);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                      (long)*(int *)(in_RDI + 0x24));
  dVar3 = *pvVar7;
  dVar4 = *(double *)(in_RDI + 0x18);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                      (long)*(int *)(in_RDI + 0x24));
  dVar5 = *pvVar7;
  dVar6 = *(double *)(in_RDI + 0x18);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),
                      (long)*(int *)(in_RDI + 0x24));
  *local_18 = dVar2 * (dVar4 * (dVar6 * *pvVar7 + dVar5) + dVar3) + dVar1;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),
                      (long)*(int *)(in_RDI + 0x24));
  dVar1 = *pvVar7;
  dVar2 = *(double *)(in_RDI + 0x18);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                      (long)*(int *)(in_RDI + 0x24));
  dVar3 = *pvVar7;
  dVar4 = *(double *)(in_RDI + 0x18);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x88),
                      (long)*(int *)(in_RDI + 0x24));
  *local_20 = dVar2 * (dVar3 + dVar3 + dVar4 * 3.0 * *pvVar7) + dVar1;
  return;
}

Assistant:

void CubicSpline::getValueAndDerivativeAt(const RealType& t, RealType& v,
                                            RealType& dv) {
    // Evaluate the spline and first derivative at t using coefficients
    //
    // Input parameters
    //   t = point where spline is to be evaluated.

    if (!generated) generate();

    //  Find the interval ( x[j], x[j+1] ) that contains or is nearest
    //  to t.

    if (isUniform) {
      j = int((t - x_[0]) * dx);

    } else {
      j = n - 1;

      for (int i = 0; i < n; i++) {
        if (t < x_[i]) {
          j = i - 1;
          break;
        }
      }
    }

    j = std::clamp(j, 0, n - 1);

    //  Evaluate the cubic polynomial.

    dt = t - x_[j];

    v  = y_[j] + dt * (b[j] + dt * (c[j] + dt * d[j]));
    dv = b[j] + dt * (2.0 * c[j] + 3.0 * dt * d[j]);
  }